

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_read_header(archive_read *a)

{
  short sVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  void *pvVar6;
  time_t tVar7;
  long local_80;
  ssize_t avail;
  cffile *file;
  cffolder *folder;
  uint32_t uStack_60;
  uint16_t cfheader;
  uint32_t offset32;
  wchar_t prev_folder;
  wchar_t cur_folder;
  wchar_t i;
  wchar_t err;
  int64_t skip;
  ssize_t len;
  size_t used;
  size_t bytes;
  cfheader *hd;
  cab *cab;
  uchar *p;
  archive_read *a_local;
  
  (a->archive).archive_format = 0xc0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "CAB";
  }
  p = (uchar *)a;
  cab = (cab *)__archive_read_ahead(a,0x2a,(ssize_t *)0x0);
  if (cab == (cab *)0x0) {
    wVar4 = truncated_error((archive_read *)p);
    return wVar4;
  }
  hd = (cfheader *)**(long **)(p + 0x9a8);
  if ((((char)hd[3].total_bytes == '\0') && ((char)cab->entry_offset == 'M')) &&
     (*(char *)((long)&cab->entry_offset + 1) == 'Z')) {
    cur_folder = cab_skip_sfx((archive_read *)p);
    if (cur_folder < L'\xffffffec') {
      return cur_folder;
    }
    cab = (cab *)__archive_read_ahead((archive_read *)p,0x2a,(ssize_t *)0x0);
    if (cab == (cab *)0x0) {
      wVar4 = truncated_error((archive_read *)p);
      return wVar4;
    }
  }
  hd[1].cabinet = 0;
  hd[1].major = '\0';
  hd[1].minor = '\0';
  hd[1].cffolder = '\0';
  hd[1].cfdata = '\0';
  *(undefined2 *)&hd[1].field_0x16 = 0;
  bytes = (size_t)&hd[1].folder_array;
  if ((((char)cab->entry_offset != 'M') || (*(char *)((long)&cab->entry_offset + 1) != 'S')) ||
     ((*(char *)((long)&cab->entry_offset + 2) != 'C' ||
      (*(char *)((long)&cab->entry_offset + 3) != 'F')))) {
    archive_set_error((archive *)p,0x54,"Couldn\'t find out CAB header");
    return L'\xffffffe2';
  }
  uVar5 = archive_le32dec(&cab->entry_bytes_remaining);
  *(uint32_t *)bytes = uVar5;
  uVar5 = archive_le32dec(&cab->entry_unconsumed);
  *(uint32_t *)(bytes + 4) = uVar5;
  *(char *)(bytes + 0x13) = (char)cab->entry_compressed_bytes_read;
  *(undefined1 *)(bytes + 0x12) = *(undefined1 *)((long)&cab->entry_compressed_bytes_read + 1);
  uVar3 = archive_le16dec((void *)((long)&cab->entry_compressed_bytes_read + 2));
  *(uint16_t *)(bytes + 8) = uVar3;
  if (*(short *)(bytes + 8) != 0) {
    uVar3 = archive_le16dec((void *)((long)&cab->entry_compressed_bytes_read + 4));
    *(uint16_t *)(bytes + 10) = uVar3;
    if (*(short *)(bytes + 10) != 0) {
      uVar3 = archive_le16dec((void *)((long)&cab->entry_compressed_bytes_read + 6));
      *(uint16_t *)(bytes + 0xc) = uVar3;
      uVar3 = archive_le16dec(&cab->entry_uncompressed_bytes_read);
      *(uint16_t *)(bytes + 0xe) = uVar3;
      uVar3 = archive_le16dec((void *)((long)&cab->entry_uncompressed_bytes_read + 2));
      *(uint16_t *)(bytes + 0x10) = uVar3;
      len = 0x24;
      if ((*(ushort *)(bytes + 0xc) & 4) == 0) {
        *(undefined1 *)(bytes + 0x14) = 0;
      }
      else {
        folder._2_2_ = archive_le16dec((void *)((long)&cab->entry_uncompressed_bytes_read + 4));
        if (60000 < folder._2_2_) goto LAB_00162c18;
        *(undefined1 *)(bytes + 0x14) =
             *(undefined1 *)((long)&cab->entry_uncompressed_bytes_read + 6);
        *(undefined1 *)(bytes + 0x15) =
             *(undefined1 *)((long)&cab->entry_uncompressed_bytes_read + 7);
        len = (ulong)folder._2_2_ + len + 4;
      }
      if ((*(ushort *)(bytes + 0xc) & 1) != 0) {
        cab = (cab *)__archive_read_ahead((archive_read *)p,len + 0x100,(ssize_t *)0x0);
        if (cab == (cab *)0x0) {
          wVar4 = truncated_error((archive_read *)p);
          return wVar4;
        }
        skip = cab_strnlen((uchar *)((long)&cab->entry_offset + len),0xff);
        if (skip < 1) goto LAB_00162c18;
        len = skip + 1 + len;
        cab = (cab *)__archive_read_ahead((archive_read *)p,len + 0x100,(ssize_t *)0x0);
        if (cab == (cab *)0x0) {
          wVar4 = truncated_error((archive_read *)p);
          return wVar4;
        }
        skip = cab_strnlen((uchar *)((long)&cab->entry_offset + len),0xff);
        if (skip < 1) goto LAB_00162c18;
        len = skip + 1 + len;
      }
      if ((*(ushort *)(bytes + 0xc) & 2) != 0) {
        cab = (cab *)__archive_read_ahead((archive_read *)p,len + 0x100,(ssize_t *)0x0);
        if (cab == (cab *)0x0) {
          wVar4 = truncated_error((archive_read *)p);
          return wVar4;
        }
        skip = cab_strnlen((uchar *)((long)&cab->entry_offset + len),0xff);
        if (skip < 1) goto LAB_00162c18;
        len = skip + 1 + len;
        cab = (cab *)__archive_read_ahead((archive_read *)p,len + 0x100,(ssize_t *)0x0);
        if (cab == (cab *)0x0) {
          wVar4 = truncated_error((archive_read *)p);
          return wVar4;
        }
        skip = cab_strnlen((uchar *)((long)&cab->entry_offset + len),0xff);
        if (skip < 1) goto LAB_00162c18;
        len = skip + 1 + len;
      }
      __archive_read_consume((archive_read *)p,len);
      *(ssize_t *)&hd[1].cabinet = len + *(long *)&hd[1].cabinet;
      len = 0;
      pvVar6 = calloc((ulong)*(ushort *)(bytes + 8),0x60);
      *(void **)(bytes + 0x18) = pvVar6;
      if (*(long *)(bytes + 0x18) != 0) {
        used = 8;
        if ((*(ushort *)(bytes + 0xc) & 4) != 0) {
          used = (ulong)*(byte *)(bytes + 0x14) + 8;
        }
        used = *(ushort *)(bytes + 8) * used;
        cab = (cab *)__archive_read_ahead((archive_read *)p,used,(ssize_t *)0x0);
        if (cab == (cab *)0x0) {
          wVar4 = truncated_error((archive_read *)p);
          return wVar4;
        }
        folder._4_4_ = 0;
        for (prev_folder = L'\0'; prev_folder < (int)(uint)*(ushort *)(bytes + 8);
            prev_folder = prev_folder + L'\x01') {
          file = (cffile *)(*(long *)(bytes + 0x18) + (long)prev_folder * 0x60);
          uVar5 = archive_le32dec(cab);
          file->uncompressed_size = uVar5;
          uVar3 = archive_le16dec((void *)((long)&cab->entry_offset + 4));
          *(uint16_t *)&file->offset = uVar3;
          uVar3 = archive_le16dec((void *)((long)&cab->entry_offset + 6));
          *(uint16_t *)((long)&file->offset + 2) = uVar3 & 0xf;
          uVar3 = archive_le16dec((void *)((long)&cab->entry_offset + 6));
          *(uint16_t *)&file->mtime = uVar3 >> 8;
          if (*(ushort *)((long)&file->offset + 2) < 4) {
            *(char **)&file->folder = compression_name[*(ushort *)((long)&file->offset + 2)];
          }
          else {
            *(char **)&file->folder = "UNKNOWN";
          }
          cab = (cab *)&cab->entry_bytes_remaining;
          len = len + 8;
          if ((*(ushort *)(bytes + 0xc) & 4) != 0) {
            cab = (cab *)((long)cab + (long)(int)(uint)*(byte *)(bytes + 0x14));
            len = (ulong)*(byte *)(bytes + 0x14) + len;
          }
          if (file->uncompressed_size <= folder._4_4_) goto LAB_00162c18;
          folder._4_4_ = file->uncompressed_size;
          *(undefined1 *)((long)&file[1].pathname.buffer_length + 4) = 0;
        }
        __archive_read_consume((archive_read *)p,len);
        *(ssize_t *)&hd[1].cabinet = len + *(long *)&hd[1].cabinet;
        _i = (ulong)*(uint *)(bytes + 4) - *(long *)&hd[1].cabinet;
        if (_i < 0) {
          uVar2._0_2_ = hd[1].cabinet;
          uVar2._2_1_ = hd[1].major;
          uVar2._3_1_ = hd[1].minor;
          uVar2._4_1_ = hd[1].cffolder;
          uVar2._5_1_ = hd[1].cfdata;
          uVar2._6_2_ = *(undefined2 *)&hd[1].field_0x16;
          archive_set_error((archive *)p,-1,"Invalid offset of CFFILE %jd < %jd",
                            (ulong)*(uint *)(bytes + 4),uVar2);
          return L'\xffffffe2';
        }
        if (_i != 0) {
          __archive_read_consume((archive_read *)p,_i);
          *(long *)&hd[1].cabinet = _i + *(long *)&hd[1].cabinet;
        }
        pvVar6 = calloc((ulong)*(ushort *)(bytes + 10),0x30);
        *(void **)(bytes + 0x20) = pvVar6;
        if (*(long *)(bytes + 0x20) != 0) {
          uStack_60 = 0xffffffff;
          prev_folder = L'\0';
          while( true ) {
            if ((int)(uint)*(ushort *)(bytes + 10) <= prev_folder) {
              if ((*(short *)(bytes + 0x10) == 0) && ((*(ushort *)(bytes + 0xc) & 3) == 0)) {
                return L'\0';
              }
              archive_set_error((archive *)p,0x54,"Multivolume cabinet file is unsupported");
              return L'\xffffffec';
            }
            avail = *(long *)(bytes + 0x20) + (long)prev_folder * 0x30;
            cab = (cab *)__archive_read_ahead((archive_read *)p,0x10,(ssize_t *)0x0);
            if (cab == (cab *)0x0) {
              wVar4 = truncated_error((archive_read *)p);
              return wVar4;
            }
            uVar5 = archive_le32dec(cab);
            *(uint32_t *)avail = uVar5;
            uVar5 = archive_le32dec((void *)((long)&cab->entry_offset + 4));
            *(uint32_t *)(avail + 4) = uVar5;
            uVar3 = archive_le16dec(&cab->entry_bytes_remaining);
            *(uint16_t *)(avail + 0x10) = uVar3;
            tVar7 = cab_dos_time((uchar *)((long)&cab->entry_bytes_remaining + 2));
            *(time_t *)(avail + 8) = tVar7;
            uVar3 = archive_le16dec((void *)((long)&cab->entry_bytes_remaining + 6));
            *(char *)(avail + 0x12) = (char)uVar3;
            __archive_read_consume((archive_read *)p,0x10);
            *(long *)&hd[1].cabinet = *(long *)&hd[1].cabinet + 0x10;
            cab = (cab *)cab_read_ahead_remaining((archive_read *)p,0x100,&local_80);
            if (cab == (cab *)0x0) {
              wVar4 = truncated_error((archive_read *)p);
              return wVar4;
            }
            skip = cab_strnlen((uchar *)cab,local_80 - 1);
            if (skip < 1) break;
            *(undefined8 *)(avail + 0x18) = 0;
            *(undefined8 *)(avail + 0x20) = 0;
            *(undefined8 *)(avail + 0x28) = 0;
            *(undefined8 *)(avail + 0x20) = 0;
            archive_strncat((archive_string *)(avail + 0x18),cab,skip);
            __archive_read_consume((archive_read *)p,skip + 1);
            *(int64_t *)&hd[1].cabinet = skip + 1 + *(long *)&hd[1].cabinet;
            if ((0x7fff8000 < *(uint *)avail) ||
               (0x7fff8000 < (ulong)*(uint *)(avail + 4) + (ulong)*(uint *)avail)) break;
            sVar1 = *(short *)(avail + 0x10);
            if (sVar1 == -3) {
LAB_00162b13:
              if (prev_folder != L'\0') break;
              offset32 = 0;
              uStack_60 = 0;
              folder._4_4_ = *(uint32_t *)(avail + 4);
            }
            else if (sVar1 == -2) {
              if (prev_folder != (uint)*(ushort *)(bytes + 10) + L'\xffffffff') break;
              offset32 = *(ushort *)(bytes + 8) - 1;
            }
            else {
              if (sVar1 == -1) {
                if (*(short *)(bytes + 10) == 1) goto LAB_00162b13;
                break;
              }
              if (*(ushort *)(bytes + 8) <= *(ushort *)(avail + 0x10)) break;
              offset32 = (uint32_t)*(ushort *)(avail + 0x10);
            }
            if ((int)offset32 < (int)uStack_60) break;
            if (offset32 != uStack_60) {
              folder._4_4_ = 0;
            }
            uStack_60 = offset32;
            if ((folder._4_4_ != *(uint32_t *)(avail + 4)) ||
               ((folder._4_4_ = *(int *)avail + folder._4_4_, *(int *)avail != 0 &&
                (*(short *)(*(long *)(bytes + 0x18) + (long)(int)offset32 * 0x60 + 4) == 0))))
            break;
            prev_folder = prev_folder + L'\x01';
          }
          goto LAB_00162c18;
        }
      }
      archive_set_error((archive *)p,0xc,"Can\'t allocate memory for CAB data");
      return L'\xffffffe2';
    }
  }
LAB_00162c18:
  archive_set_error((archive *)p,0x54,"Invalid CAB header");
  return L'\xffffffe2';
}

Assistant:

static int
cab_read_header(struct archive_read *a)
{
	const unsigned char *p;
	struct cab *cab;
	struct cfheader *hd;
	size_t bytes, used;
	ssize_t len;
	int64_t skip;
	int err, i;
	int cur_folder, prev_folder;
	uint32_t offset32;
	
	a->archive.archive_format = ARCHIVE_FORMAT_CAB;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "CAB";

	if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
		return (truncated_error(a));

	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0 &&
	    p[0] == 'M' && p[1] == 'Z') {
		/* This is an executable?  Must be self-extracting... */
		err = cab_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		/* Re-read header after processing the SFX. */
		if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
			return (truncated_error(a));
	}

	cab->cab_offset = 0;
	/*
	 * Read CFHEADER.
	 */
	hd = &cab->cfheader;
	if (p[CFHEADER_signature+0] != 'M' || p[CFHEADER_signature+1] != 'S' ||
	    p[CFHEADER_signature+2] != 'C' || p[CFHEADER_signature+3] != 'F') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Couldn't find out CAB header");
		return (ARCHIVE_FATAL);
	}
	hd->total_bytes = archive_le32dec(p + CFHEADER_cbCabinet);
	hd->files_offset = archive_le32dec(p + CFHEADER_coffFiles);
	hd->minor = p[CFHEADER_versionMinor];
	hd->major = p[CFHEADER_versionMajor];
	hd->folder_count = archive_le16dec(p + CFHEADER_cFolders);
	if (hd->folder_count == 0)
		goto invalid;
	hd->file_count = archive_le16dec(p + CFHEADER_cFiles);
	if (hd->file_count == 0)
		goto invalid;
	hd->flags = archive_le16dec(p + CFHEADER_flags);
	hd->setid = archive_le16dec(p + CFHEADER_setID);
	hd->cabinet = archive_le16dec(p + CFHEADER_iCabinet);
	used = CFHEADER_iCabinet + 2;
	if (hd->flags & RESERVE_PRESENT) {
		uint16_t cfheader;
		cfheader = archive_le16dec(p + CFHEADER_cbCFHeader);
		if (cfheader > 60000U)
			goto invalid;
		hd->cffolder = p[CFHEADER_cbCFFolder];
		hd->cfdata = p[CFHEADER_cbCFData];
		used += 4;/* cbCFHeader, cbCFFolder and cbCFData */
		used += cfheader;/* abReserve */
	} else
		hd->cffolder = 0;/* Avoid compiling warning. */
	if (hd->flags & PREV_CABINET) {
		/* How many bytes are used for szCabinetPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	if (hd->flags & NEXT_CABINET) {
		/* How many bytes are used for szCabinetNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;
	used = 0;

	/*
	 * Read CFFOLDER.
	 */
	hd->folder_array = (struct cffolder *)calloc(
	    hd->folder_count, sizeof(struct cffolder));
	if (hd->folder_array == NULL)
		goto nomem;
	
	bytes = 8;
	if (hd->flags & RESERVE_PRESENT)
		bytes += hd->cffolder;
	bytes *= hd->folder_count;
	if ((p = __archive_read_ahead(a, bytes, NULL)) == NULL)
		return (truncated_error(a));
	offset32 = 0;
	for (i = 0; i < hd->folder_count; i++) {
		struct cffolder *folder = &(hd->folder_array[i]);
		folder->cfdata_offset_in_cab =
		    archive_le32dec(p + CFFOLDER_coffCabStart);
		folder->cfdata_count = archive_le16dec(p+CFFOLDER_cCFData);
		folder->comptype =
		    archive_le16dec(p+CFFOLDER_typeCompress) & 0x0F;
		folder->compdata =
		    archive_le16dec(p+CFFOLDER_typeCompress) >> 8;
		/* Get a compression name. */
		if (folder->comptype <
		    sizeof(compression_name) / sizeof(compression_name[0]))
			folder->compname = compression_name[folder->comptype];
		else
			folder->compname = "UNKNOWN";
		p += 8;
		used += 8;
		if (hd->flags & RESERVE_PRESENT) {
			p += hd->cffolder;/* abReserve */
			used += hd->cffolder;
		}
		/*
		 * Sanity check if each data is acceptable.
		 */
		if (offset32 >= folder->cfdata_offset_in_cab)
			goto invalid;
		offset32 = folder->cfdata_offset_in_cab;

		/* Set a request to initialize zlib for the CFDATA of
		 * this folder. */
		folder->decompress_init = 0;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;

	/*
	 * Read CFFILE.
	 */
	/* Seek read pointer to the offset of CFFILE if needed. */
	skip = (int64_t)hd->files_offset - cab->cab_offset;
	if (skip <  0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid offset of CFFILE %jd < %jd",
		    (intmax_t)hd->files_offset, (intmax_t)cab->cab_offset);
		return (ARCHIVE_FATAL);
	}
	if (skip) {
		__archive_read_consume(a, skip);
		cab->cab_offset += skip;
	}
	/* Allocate memory for CFDATA */
	hd->file_array = (struct cffile *)calloc(
	    hd->file_count, sizeof(struct cffile));
	if (hd->file_array == NULL)
		goto nomem;

	prev_folder = -1;
	for (i = 0; i < hd->file_count; i++) {
		struct cffile *file = &(hd->file_array[i]);
		ssize_t avail;

		if ((p = __archive_read_ahead(a, 16, NULL)) == NULL)
			return (truncated_error(a));
		file->uncompressed_size = archive_le32dec(p + CFFILE_cbFile);
		file->offset = archive_le32dec(p + CFFILE_uoffFolderStart);
		file->folder = archive_le16dec(p + CFFILE_iFolder);
		file->mtime = cab_dos_time(p + CFFILE_date_time);
		file->attr = (uint8_t)archive_le16dec(p + CFFILE_attribs);
		__archive_read_consume(a, 16);

		cab->cab_offset += 16;
		if ((p = cab_read_ahead_remaining(a, 256, &avail)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p, avail-1)) <= 0)
			goto invalid;

		/* Copy a pathname.  */
		archive_string_init(&(file->pathname));
		archive_strncpy(&(file->pathname), p, len);
		__archive_read_consume(a, len + 1);
		cab->cab_offset += len + 1;

		/*
		 * Sanity check if each data is acceptable.
		 */
		if (file->uncompressed_size > 0x7FFF8000)
			goto invalid;/* Too large */
		if ((int64_t)file->offset + (int64_t)file->uncompressed_size
		    > ARCHIVE_LITERAL_LL(0x7FFF8000))
			goto invalid;/* Too large */
		switch (file->folder) {
		case iFoldCONTINUED_TO_NEXT:
			/* This must be last file in a folder. */
			if (i != hd->file_count -1)
				goto invalid;
			cur_folder = hd->folder_count -1;
			break;
		case iFoldCONTINUED_PREV_AND_NEXT:
			/* This must be only one file in a folder. */
			if (hd->file_count != 1)
				goto invalid;
			/* FALL THROUGH */
		case iFoldCONTINUED_FROM_PREV:
			/* This must be first file in a folder. */
			if (i != 0)
				goto invalid;
			prev_folder = cur_folder = 0;
			offset32 = file->offset;
			break;
		default:
			if (file->folder >= hd->folder_count)
				goto invalid;
			cur_folder = file->folder;
			break;
		}
		/* Dot not back track. */
		if (cur_folder < prev_folder)
			goto invalid;
		if (cur_folder != prev_folder)
			offset32 = 0;
		prev_folder = cur_folder;

		/* Make sure there are not any blanks from last file
		 * contents. */
		if (offset32 != file->offset)
			goto invalid;
		offset32 += file->uncompressed_size;

		/* CFDATA is available for file contents. */
		if (file->uncompressed_size > 0 &&
		    hd->folder_array[cur_folder].cfdata_count == 0)
			goto invalid;
	}

	if (hd->cabinet != 0 || hd->flags & (PREV_CABINET | NEXT_CABINET)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Multivolume cabinet file is unsupported");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CAB header");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "Can't allocate memory for CAB data");
	return (ARCHIVE_FATAL);
}